

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O1

int * Fra_ClauCreateMapping(Vec_Int_t *vSatVarsFrom,Vec_Int_t *vSatVarsTo,int nVarsMax)

{
  uint uVar1;
  uint uVar2;
  int *__s;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = vSatVarsFrom->nSize;
  uVar2 = vSatVarsTo->nSize;
  if (uVar1 != uVar2) {
    __assert_fail("Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraClau.c"
                  ,0x9d,"int *Fra_ClauCreateMapping(Vec_Int_t *, Vec_Int_t *, int)");
  }
  __s = (int *)malloc((long)nVarsMax * 4);
  if (0 < nVarsMax) {
    memset(__s,0xff,(ulong)(uint)nVarsMax << 2);
  }
  if (0 < (int)uVar1) {
    uVar3 = 0;
    uVar4 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar4 = uVar3;
    }
    do {
      if (uVar4 == uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      __s[vSatVarsFrom->pArray[uVar3]] = vSatVarsTo->pArray[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  return __s;
}

Assistant:

int * Fra_ClauCreateMapping( Vec_Int_t * vSatVarsFrom, Vec_Int_t * vSatVarsTo, int nVarsMax )
{
    int * pMapping, Var, i;
    assert( Vec_IntSize(vSatVarsFrom) == Vec_IntSize(vSatVarsTo) );
    pMapping = ABC_ALLOC( int, nVarsMax );
    for ( i = 0; i < nVarsMax; i++ )
        pMapping[i] = -1;
    Vec_IntForEachEntry( vSatVarsFrom, Var, i )
        pMapping[Var] = Vec_IntEntry(vSatVarsTo,i);
    return pMapping;
}